

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pass2_strategy.c
# Opt level: O0

int find_qindex_by_rate_with_correction
              (uint64_t desired_bits_per_mb,aom_bit_depth_t bit_depth,double error_per_mb,
              double group_weight_factor,int best_qindex,int worst_qindex)

{
  ulong uVar1;
  int in_ECX;
  int in_EDX;
  ulong in_RDI;
  double dVar2;
  double dVar3;
  double in_XMM1_Qa;
  uint64_t mid_bits_per_mb;
  double q;
  double q_factor;
  int mid;
  int high;
  int low;
  aom_bit_depth_t in_stack_ffffffffffffffa8;
  int in_stack_ffffffffffffffac;
  int iVar4;
  
  while (iVar4 = in_ECX, in_EDX < iVar4) {
    in_ECX = in_EDX + iVar4 >> 1;
    dVar2 = calc_correction_factor((double)CONCAT44(in_EDX,iVar4),in_ECX);
    dVar3 = av1_convert_qindex_to_q(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8);
    dVar3 = (dVar2 * in_XMM1_Qa) / dVar3;
    uVar1 = (ulong)dVar3;
    if (in_RDI < (uVar1 | (long)(dVar3 - 9.223372036854776e+18) & (long)uVar1 >> 0x3f)) {
      in_EDX = in_ECX + 1;
      in_ECX = iVar4;
    }
  }
  return in_EDX;
}

Assistant:

static int find_qindex_by_rate_with_correction(uint64_t desired_bits_per_mb,
                                               aom_bit_depth_t bit_depth,
                                               double error_per_mb,
                                               double group_weight_factor,
                                               int best_qindex,
                                               int worst_qindex) {
  assert(best_qindex <= worst_qindex);
  int low = best_qindex;
  int high = worst_qindex;

  while (low < high) {
    const int mid = (low + high) >> 1;
    const double q_factor = calc_correction_factor(error_per_mb, mid);
    const double q = av1_convert_qindex_to_q(mid, bit_depth);
    const uint64_t mid_bits_per_mb =
        (uint64_t)((q_factor * group_weight_factor) / q);

    if (mid_bits_per_mb > desired_bits_per_mb) {
      low = mid + 1;
    } else {
      high = mid;
    }
  }
  return low;
}